

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QString,_QVariant> * __thiscall
QHashPrivate::iterator<QHashPrivate::Node<QString,_QVariant>_>::node
          (iterator<QHashPrivate::Node<QString,_QVariant>_> *this)

{
  Span *pSVar1;
  ulong uVar2;
  
  pSVar1 = this->d->spans;
  uVar2 = this->bucket >> 7;
  return (Node<QString,_QVariant> *)
         (pSVar1[uVar2].entries + pSVar1[uVar2].offsets[(uint)this->bucket & 0x7f]);
}

Assistant:

inline Node *node() const noexcept
    {
        Q_ASSERT(!isUnused());
        return &d->spans[span()].at(index());
    }